

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O0

int __thiscall PFData::getSubgridIndexX(PFData *this,int idx)

{
  int iVar1;
  int iVar2;
  int in_ESI;
  PFData *in_RDI;
  int size;
  int start;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_4;
  
  iVar1 = getNormalBlockStartX
                    ((PFData *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  iVar2 = getNormalBlockSizeX(in_RDI);
  if (in_ESI < iVar1) {
    local_4 = in_ESI / (iVar2 + 1);
  }
  else {
    local_4 = in_RDI->m_nx % in_RDI->m_p + (in_ESI - iVar1) / iVar2;
  }
  return local_4;
}

Assistant:

int PFData::getSubgridIndexX(int idx) const{
    const int start = getNormalBlockStartX();
    const int size = getNormalBlockSizeX();
    if(idx < start){   //In remainder subgrid
        return idx/(size+1);
    }

    //In normal block subgrids
    //Number of remainder blocks + number of normal blocks
    return (m_nx % m_p) + (idx - start)/size;
}